

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::DefaultPrintTo<std::vector<bool,std::allocator<bool>>>
               (undefined8 param_1,undefined8 *param_2,ostream *param_3)

{
  uint uVar1;
  long lVar2;
  ulong *puVar3;
  int iVar4;
  ulong uVar5;
  
  std::operator<<(param_3,'{');
  puVar3 = (ulong *)*param_2;
  uVar5 = 0;
  lVar2 = 0;
  while( true ) {
    iVar4 = (int)uVar5;
    if ((puVar3 == (ulong *)param_2[2]) && (iVar4 == *(int *)(param_2 + 3))) {
      if (lVar2 == 0) goto LAB_00123148;
      goto LAB_0012313d;
    }
    if ((lVar2 != 0) && (std::operator<<(param_3,','), lVar2 == 0x20)) break;
    std::operator<<(param_3,' ');
    PrintTo((*puVar3 >> (uVar5 & 0x3f) & 1) != 0,param_3);
    puVar3 = puVar3 + (iVar4 == 0x3f);
    uVar1 = iVar4 + 1;
    if (iVar4 == 0x3f) {
      uVar1 = 0;
    }
    lVar2 = lVar2 + 1;
    uVar5 = (ulong)uVar1;
  }
  std::operator<<(param_3," ...");
LAB_0012313d:
  std::operator<<(param_3,' ');
LAB_00123148:
  std::operator<<(param_3,'}');
  return;
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}